

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

void WriteVectorToFile<xLearn::Node>
               (FILE *file_ptr,vector<xLearn::Node,_std::allocator<xLearn::Node>_> *vec)

{
  pointer pNVar1;
  pointer pNVar2;
  ostream *poVar3;
  allocator local_5e;
  allocator local_5d;
  Logger local_5c;
  size_t len;
  string local_38;
  
  if (file_ptr == (FILE *)0x0) {
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&len,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_38,"WriteVectorToFile",&local_5e);
    poVar3 = Logger::Start(ERR,(string *)&len,0x10f,&local_38);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10f);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"file_ptr");
    std::operator<<(poVar3," == NULL \n");
  }
  else {
    pNVar1 = (vec->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pNVar2 = (vec->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pNVar1 != pNVar2) {
      len = ((long)pNVar2 - (long)pNVar1) / 0xc;
      WriteDataToDisk(file_ptr,(char *)&len,8);
      WriteDataToDisk(file_ptr,(char *)(vec->
                                       super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>
                                       )._M_impl.super__Vector_impl_data._M_start,len * 0xc);
      return;
    }
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&len,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_38,"WriteVectorToFile",&local_5e);
    poVar3 = Logger::Start(ERR,(string *)&len,0x111,&local_38);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x111);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"!vec.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&len);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

void WriteVectorToFile(FILE *file_ptr, const std::vector<T> &vec) {
  CHECK_NOTNULL(file_ptr);
  // We do not want to serialize an empty vector
  CHECK(!vec.empty());
  size_t len = vec.size();
  // First, write the length of this vector
  WriteDataToDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  // Then, write the data of this vector
  WriteDataToDisk(file_ptr, (char *)(vec.data()), sizeof(T)*len);
}